

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O3

error mirror_dgpr<0>(context *ctx,token *token,opcode *op)

{
  ulong uVar1;
  int in_ECX;
  undefined4 in_register_0000000c;
  error *err;
  
  uVar1 = *(ulong *)CONCAT44(in_register_0000000c,in_ECX);
  *(ulong *)CONCAT44(in_register_0000000c,in_ECX) = uVar1 & 0xffffffffffffff00;
  assemble_dest_gpr(ctx,token,op,in_ECX);
  if (ctx->pc == 0) {
    if (*(ulong *)CONCAT44(in_register_0000000c,in_ECX) == uVar1) {
      ctx->pc = 0;
    }
    else {
      fail((token *)ctx,(char *)op,"source register is not mirrored to destination register");
    }
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

DEFINE_OPERAND(mirror_dgpr)
{
    // Hack mirror detecting by restoring the bits and then comparing
    const uint64_t old_op_value = op.value;
    op.value &= ~(uint64_t{0xff} << address);
    if (auto err = dgpr<address>(ctx, token, op)) {
        return err;
    }
    if (op.value != old_op_value) {
        return fail(token, "source register is not mirrored to destination register");
    }
    return {};
}